

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::add_extensions_to_torrent
          (session_impl *this,shared_ptr<libtorrent::aux::torrent> *torrent_ptr,
          client_data_t userdata)

{
  bool bVar1;
  reference this_00;
  element_type *peVar2;
  element_type *this_01;
  shared_ptr<libtorrent::torrent_plugin> local_98 [2];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  shared_ptr<libtorrent::torrent_plugin> tp;
  shared_ptr<libtorrent::plugin> *e;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  shared_ptr<libtorrent::aux::torrent> *torrent_ptr_local;
  session_impl *this_local;
  client_data_t userdata_local;
  
  this_00 = ::std::
            array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
            ::operator[](&this->m_ses_extensions,0);
  __end2 = ::std::
           vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
           ::begin(this_00);
  e = (shared_ptr<libtorrent::plugin> *)
      ::std::
      vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
      ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
                                     *)&e), bVar1) {
    tp.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
           ::operator*(&__end2);
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)tp.
                           super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
    ::std::__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)torrent_ptr);
    torrent::get_handle((torrent *)local_68);
    this_local._0_4_ = userdata.m_type_ptr._0_4_;
    this_local._4_4_ = userdata.m_type_ptr._4_4_;
    userdata_local.m_type_ptr._0_4_ = userdata.m_client_ptr._0_4_;
    userdata_local.m_type_ptr._4_4_ = userdata.m_client_ptr._4_4_;
    local_78 = this_local._0_4_;
    uStack_74 = this_local._4_4_;
    uStack_70 = userdata_local.m_type_ptr._0_4_;
    uStack_6c = userdata_local.m_type_ptr._4_4_;
    (*peVar2->_vptr_plugin[3])
              (local_58,peVar2,(torrent *)local_68,userdata.m_type_ptr,userdata.m_client_ptr);
    torrent_handle::~torrent_handle((torrent_handle *)local_68);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
    if (bVar1) {
      this_01 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)torrent_ptr);
      ::std::shared_ptr<libtorrent::torrent_plugin>::shared_ptr
                (local_98,(shared_ptr<libtorrent::torrent_plugin> *)local_58);
      torrent::add_extension(this_01,local_98);
      ::std::shared_ptr<libtorrent::torrent_plugin>::~shared_ptr(local_98);
    }
    ::std::shared_ptr<libtorrent::torrent_plugin>::~shared_ptr
              ((shared_ptr<libtorrent::torrent_plugin> *)local_58);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::plugin>_*,_std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void session_impl::add_extensions_to_torrent(
		std::shared_ptr<torrent> const& torrent_ptr, client_data_t const userdata)
	{
		for (auto& e : m_ses_extensions[plugins_all_idx])
		{
			std::shared_ptr<torrent_plugin> tp(e->new_torrent(
				torrent_ptr->get_handle(), userdata));
			if (tp) torrent_ptr->add_extension(std::move(tp));
		}
	}